

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  uint8_t *puVar1;
  bool bVar2;
  string_view s_00;
  int iVar3;
  size_type __n;
  const_pointer __src;
  ptrdiff_t size;
  uint8_t *ptr_local;
  uint32_t num_local;
  EpsCopyOutputStream *this_local;
  string_view s_local;
  byte *local_18;
  uint local_c;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (EpsCopyOutputStream *)s._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  bVar2 = true;
  if ((long)__n < 0x80) {
    puVar1 = this->end_;
    iVar3 = TagSize(num << 3);
    bVar2 = (long)(puVar1 + (-(long)iVar3 - (long)ptr) + 0xf) < (long)__n;
  }
  if (bVar2) {
    s_00._M_str = (char *)s_local._M_len;
    s_00._M_len = (size_t)this_local;
    s_local._M_str = (char *)WriteStringMaybeAliasedOutline(this,num,s_00,ptr);
  }
  else {
    local_18 = ptr;
    for (local_c = num << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    *local_18 = (byte)local_c;
    local_18[1] = (byte)__n;
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    memcpy(local_18 + 2,__src,__n);
    s_local._M_str = (char *)(local_18 + 2 + __n);
  }
  return (uint8_t *)s_local._M_str;
}

Assistant:

uint8_t* WriteStringMaybeAliased(uint32_t num, absl::string_view s,
                                   uint8_t* ptr) {
    std::ptrdiff_t size = s.size();
    if (ABSL_PREDICT_FALSE(size >= 128 ||
                           end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8_t>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }